

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharClass.hpp
# Opt level: O0

array<Centaurus::CharClass<wchar_t>,_3UL> * __thiscall
Centaurus::CharClass<wchar_t>::diff_and_int
          (array<Centaurus::CharClass<wchar_t>,_3UL> *__return_storage_ptr__,
          CharClass<wchar_t> *this,CharClass<wchar_t> *cc)

{
  bool bVar1;
  wchar_t wVar2;
  wchar_t wVar3;
  reference pvVar4;
  __normal_iterator<const_Centaurus::Range<wchar_t>_*,_std::vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>_>
  *p_Var5;
  reference pRVar6;
  bool local_141;
  __normal_iterator<const_Centaurus::Range<wchar_t>_*,_std::vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>_>
  local_128;
  __normal_iterator<const_Centaurus::Range<wchar_t>_*,_std::vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>_>
  local_120;
  __normal_iterator<const_Centaurus::Range<wchar_t>_*,_std::vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>_>
  local_118;
  __normal_iterator<const_Centaurus::Range<wchar_t>_*,_std::vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>_>
  local_110;
  __normal_iterator<const_Centaurus::Range<wchar_t>_*,_std::vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>_>
  local_108;
  __normal_iterator<const_Centaurus::Range<wchar_t>_*,_std::vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>_>
  local_100;
  Range<wchar_t> local_f8;
  __normal_iterator<const_Centaurus::Range<wchar_t>_*,_std::vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>_>
  local_e8;
  Range<wchar_t> local_e0;
  __normal_iterator<const_Centaurus::Range<wchar_t>_*,_std::vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>_>
  local_d0;
  Range<wchar_t> local_c8;
  Range<wchar_t> local_b8;
  Range<wchar_t> local_a8;
  __normal_iterator<const_Centaurus::Range<wchar_t>_*,_std::vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>_>
  local_98;
  __normal_iterator<const_Centaurus::Range<wchar_t>_*,_std::vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>_>
  local_90;
  __normal_iterator<const_Centaurus::Range<wchar_t>_*,_std::vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>_>
  local_88;
  __normal_iterator<const_Centaurus::Range<wchar_t>_*,_std::vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>_>
  local_80;
  __normal_iterator<const_Centaurus::Range<wchar_t>_*,_std::vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>_>
  local_78;
  __normal_iterator<const_Centaurus::Range<wchar_t>_*,_std::vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>_>
  local_70;
  undefined1 local_68 [8];
  Range<wchar_t> rj;
  undefined1 local_48 [8];
  Range<wchar_t> ri;
  const_iterator j;
  const_iterator i;
  CharClass<wchar_t> *cc_local;
  CharClass<wchar_t> *this_local;
  array<Centaurus::CharClass<wchar_t>,_3UL> *ret;
  
  std::array<Centaurus::CharClass<wchar_t>,_3UL>::array(__return_storage_ptr__);
  j = std::vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>::cbegin
                (&this->m_ranges);
  ri._8_8_ = std::vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>::
             cbegin(&cc->m_ranges);
  Range<wchar_t>::Range((Range<wchar_t> *)local_48);
  Range<wchar_t>::Range((Range<wchar_t> *)local_68);
  local_70._M_current =
       (Range<wchar_t> *)
       std::vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>::cend
                 (&this->m_ranges);
  bVar1 = __gnu_cxx::operator!=(&j,&local_70);
  if (bVar1) {
    pRVar6 = __gnu_cxx::
             __normal_iterator<const_Centaurus::Range<wchar_t>_*,_std::vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>_>
             ::operator*(&j);
    Range<wchar_t>::operator=((Range<wchar_t> *)local_48,pRVar6);
  }
  local_78._M_current =
       (Range<wchar_t> *)
       std::vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>::cend
                 (&cc->m_ranges);
  bVar1 = __gnu_cxx::operator!=
                    ((__normal_iterator<const_Centaurus::Range<wchar_t>_*,_std::vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>_>
                      *)&ri.m_start,&local_78);
  if (bVar1) {
    pRVar6 = __gnu_cxx::
             __normal_iterator<const_Centaurus::Range<wchar_t>_*,_std::vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>_>
             ::operator*((__normal_iterator<const_Centaurus::Range<wchar_t>_*,_std::vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>_>
                          *)&ri.m_start);
    Range<wchar_t>::operator=((Range<wchar_t> *)local_68,pRVar6);
  }
  while( true ) {
    local_80._M_current =
         (Range<wchar_t> *)
         std::vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>::cend
                   (&this->m_ranges);
    bVar1 = __gnu_cxx::operator!=(&j,&local_80);
    local_141 = false;
    if (bVar1) {
      local_88._M_current =
           (Range<wchar_t> *)
           std::vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>::cend
                     (&cc->m_ranges);
      local_141 = __gnu_cxx::operator!=
                            ((__normal_iterator<const_Centaurus::Range<wchar_t>_*,_std::vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>_>
                              *)&ri.m_start,&local_88);
    }
    if (local_141 == false) break;
    bVar1 = Range<wchar_t>::operator<((Range<wchar_t> *)local_48,(Range<wchar_t> *)local_68);
    if (bVar1) {
      pvVar4 = std::array<Centaurus::CharClass<wchar_t>,_3UL>::operator[](__return_storage_ptr__,0);
      append(pvVar4,(Range<wchar_t> *)local_48);
      p_Var5 = __gnu_cxx::
               __normal_iterator<const_Centaurus::Range<wchar_t>_*,_std::vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>_>
               ::operator++(&j);
      local_90._M_current =
           (Range<wchar_t> *)
           std::vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>::cend
                     (&this->m_ranges);
      bVar1 = __gnu_cxx::operator!=(p_Var5,&local_90);
      if (bVar1) {
        pRVar6 = __gnu_cxx::
                 __normal_iterator<const_Centaurus::Range<wchar_t>_*,_std::vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>_>
                 ::operator*(&j);
        Range<wchar_t>::operator=((Range<wchar_t> *)local_48,pRVar6);
      }
    }
    else {
      bVar1 = Range<wchar_t>::operator>((Range<wchar_t> *)local_48,(Range<wchar_t> *)local_68);
      if (bVar1) {
        pvVar4 = std::array<Centaurus::CharClass<wchar_t>,_3UL>::operator[]
                           (__return_storage_ptr__,1);
        append(pvVar4,(Range<wchar_t> *)local_68);
        p_Var5 = __gnu_cxx::
                 __normal_iterator<const_Centaurus::Range<wchar_t>_*,_std::vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>_>
                 ::operator++((__normal_iterator<const_Centaurus::Range<wchar_t>_*,_std::vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>_>
                               *)&ri.m_start);
        local_98._M_current =
             (Range<wchar_t> *)
             std::vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>::
             cend(&cc->m_ranges);
        bVar1 = __gnu_cxx::operator!=(p_Var5,&local_98);
        if (bVar1) {
          pRVar6 = __gnu_cxx::
                   __normal_iterator<const_Centaurus::Range<wchar_t>_*,_std::vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>_>
                   ::operator*((__normal_iterator<const_Centaurus::Range<wchar_t>_*,_std::vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>_>
                                *)&ri.m_start);
          Range<wchar_t>::operator=((Range<wchar_t> *)local_68,pRVar6);
        }
      }
      else {
        wVar2 = Range<wchar_t>::start((Range<wchar_t> *)local_48);
        wVar3 = Range<wchar_t>::start((Range<wchar_t> *)local_68);
        if (wVar2 < wVar3) {
          pvVar4 = std::array<Centaurus::CharClass<wchar_t>,_3UL>::operator[]
                             (__return_storage_ptr__,0);
          wVar2 = Range<wchar_t>::start((Range<wchar_t> *)local_48);
          wVar3 = Range<wchar_t>::start((Range<wchar_t> *)local_68);
          Range<wchar_t>::Range(&local_a8,wVar2,wVar3);
          append(pvVar4,&local_a8);
          Range<wchar_t>::~Range(&local_a8);
          wVar2 = Range<wchar_t>::start((Range<wchar_t> *)local_68);
          Range<wchar_t>::start((Range<wchar_t> *)local_48,wVar2);
        }
        else {
          wVar2 = Range<wchar_t>::start((Range<wchar_t> *)local_68);
          wVar3 = Range<wchar_t>::start((Range<wchar_t> *)local_48);
          if (wVar2 < wVar3) {
            pvVar4 = std::array<Centaurus::CharClass<wchar_t>,_3UL>::operator[]
                               (__return_storage_ptr__,1);
            wVar2 = Range<wchar_t>::start((Range<wchar_t> *)local_68);
            wVar3 = Range<wchar_t>::start((Range<wchar_t> *)local_48);
            Range<wchar_t>::Range(&local_b8,wVar2,wVar3);
            append(pvVar4,&local_b8);
            Range<wchar_t>::~Range(&local_b8);
            wVar2 = Range<wchar_t>::start((Range<wchar_t> *)local_48);
            Range<wchar_t>::start((Range<wchar_t> *)local_68,wVar2);
          }
          else {
            wVar2 = Range<wchar_t>::end((Range<wchar_t> *)local_48);
            wVar3 = Range<wchar_t>::end((Range<wchar_t> *)local_68);
            if (wVar3 < wVar2) {
              pvVar4 = std::array<Centaurus::CharClass<wchar_t>,_3UL>::operator[]
                                 (__return_storage_ptr__,2);
              wVar2 = Range<wchar_t>::start((Range<wchar_t> *)local_68);
              wVar3 = Range<wchar_t>::end((Range<wchar_t> *)local_68);
              Range<wchar_t>::Range(&local_c8,wVar2,wVar3);
              append(pvVar4,&local_c8);
              Range<wchar_t>::~Range(&local_c8);
              wVar2 = Range<wchar_t>::end((Range<wchar_t> *)local_68);
              Range<wchar_t>::start((Range<wchar_t> *)local_48,wVar2);
              p_Var5 = __gnu_cxx::
                       __normal_iterator<const_Centaurus::Range<wchar_t>_*,_std::vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>_>
                       ::operator++((__normal_iterator<const_Centaurus::Range<wchar_t>_*,_std::vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>_>
                                     *)&ri.m_start);
              local_d0._M_current =
                   (Range<wchar_t> *)
                   std::
                   vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>::
                   cend(&cc->m_ranges);
              bVar1 = __gnu_cxx::operator!=(p_Var5,&local_d0);
              if (bVar1) {
                pRVar6 = __gnu_cxx::
                         __normal_iterator<const_Centaurus::Range<wchar_t>_*,_std::vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>_>
                         ::operator*((__normal_iterator<const_Centaurus::Range<wchar_t>_*,_std::vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>_>
                                      *)&ri.m_start);
                Range<wchar_t>::operator=((Range<wchar_t> *)local_68,pRVar6);
              }
            }
            else {
              wVar2 = Range<wchar_t>::end((Range<wchar_t> *)local_48);
              wVar3 = Range<wchar_t>::end((Range<wchar_t> *)local_68);
              if (wVar2 < wVar3) {
                pvVar4 = std::array<Centaurus::CharClass<wchar_t>,_3UL>::operator[]
                                   (__return_storage_ptr__,2);
                wVar2 = Range<wchar_t>::start((Range<wchar_t> *)local_48);
                wVar3 = Range<wchar_t>::end((Range<wchar_t> *)local_48);
                Range<wchar_t>::Range(&local_e0,wVar2,wVar3);
                append(pvVar4,&local_e0);
                Range<wchar_t>::~Range(&local_e0);
                wVar2 = Range<wchar_t>::end((Range<wchar_t> *)local_48);
                Range<wchar_t>::start((Range<wchar_t> *)local_68,wVar2);
                p_Var5 = __gnu_cxx::
                         __normal_iterator<const_Centaurus::Range<wchar_t>_*,_std::vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>_>
                         ::operator++(&j);
                local_e8._M_current =
                     (Range<wchar_t> *)
                     std::
                     vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>
                     ::cend(&this->m_ranges);
                bVar1 = __gnu_cxx::operator!=(p_Var5,&local_e8);
                if (bVar1) {
                  pRVar6 = __gnu_cxx::
                           __normal_iterator<const_Centaurus::Range<wchar_t>_*,_std::vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>_>
                           ::operator*(&j);
                  Range<wchar_t>::operator=((Range<wchar_t> *)local_48,pRVar6);
                }
              }
              else {
                pvVar4 = std::array<Centaurus::CharClass<wchar_t>,_3UL>::operator[]
                                   (__return_storage_ptr__,2);
                wVar2 = Range<wchar_t>::start((Range<wchar_t> *)local_48);
                wVar3 = Range<wchar_t>::end((Range<wchar_t> *)local_68);
                Range<wchar_t>::Range(&local_f8,wVar2,wVar3);
                append(pvVar4,&local_f8);
                Range<wchar_t>::~Range(&local_f8);
                p_Var5 = __gnu_cxx::
                         __normal_iterator<const_Centaurus::Range<wchar_t>_*,_std::vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>_>
                         ::operator++(&j);
                local_100._M_current =
                     (Range<wchar_t> *)
                     std::
                     vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>
                     ::cend(&this->m_ranges);
                bVar1 = __gnu_cxx::operator!=(p_Var5,&local_100);
                if (bVar1) {
                  pRVar6 = __gnu_cxx::
                           __normal_iterator<const_Centaurus::Range<wchar_t>_*,_std::vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>_>
                           ::operator*(&j);
                  Range<wchar_t>::operator=((Range<wchar_t> *)local_48,pRVar6);
                }
                p_Var5 = __gnu_cxx::
                         __normal_iterator<const_Centaurus::Range<wchar_t>_*,_std::vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>_>
                         ::operator++((__normal_iterator<const_Centaurus::Range<wchar_t>_*,_std::vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>_>
                                       *)&ri.m_start);
                local_108._M_current =
                     (Range<wchar_t> *)
                     std::
                     vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>
                     ::cend(&cc->m_ranges);
                bVar1 = __gnu_cxx::operator!=(p_Var5,&local_108);
                if (bVar1) {
                  pRVar6 = __gnu_cxx::
                           __normal_iterator<const_Centaurus::Range<wchar_t>_*,_std::vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>_>
                           ::operator*((__normal_iterator<const_Centaurus::Range<wchar_t>_*,_std::vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>_>
                                        *)&ri.m_start);
                  Range<wchar_t>::operator=((Range<wchar_t> *)local_68,pRVar6);
                }
              }
            }
          }
        }
      }
    }
  }
  while( true ) {
    local_110._M_current =
         (Range<wchar_t> *)
         std::vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>::cend
                   (&this->m_ranges);
    bVar1 = __gnu_cxx::operator!=(&j,&local_110);
    if (!bVar1) break;
    pvVar4 = std::array<Centaurus::CharClass<wchar_t>,_3UL>::operator[](__return_storage_ptr__,0);
    append(pvVar4,(Range<wchar_t> *)local_48);
    p_Var5 = __gnu_cxx::
             __normal_iterator<const_Centaurus::Range<wchar_t>_*,_std::vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>_>
             ::operator++(&j);
    local_118._M_current =
         (Range<wchar_t> *)
         std::vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>::cend
                   (&this->m_ranges);
    bVar1 = __gnu_cxx::operator!=(p_Var5,&local_118);
    if (bVar1) {
      pRVar6 = __gnu_cxx::
               __normal_iterator<const_Centaurus::Range<wchar_t>_*,_std::vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>_>
               ::operator*(&j);
      Range<wchar_t>::operator=((Range<wchar_t> *)local_48,pRVar6);
    }
  }
  while( true ) {
    local_120._M_current =
         (Range<wchar_t> *)
         std::vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>::cend
                   (&cc->m_ranges);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_Centaurus::Range<wchar_t>_*,_std::vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>_>
                        *)&ri.m_start,&local_120);
    if (!bVar1) break;
    pvVar4 = std::array<Centaurus::CharClass<wchar_t>,_3UL>::operator[](__return_storage_ptr__,1);
    append(pvVar4,(Range<wchar_t> *)local_68);
    p_Var5 = __gnu_cxx::
             __normal_iterator<const_Centaurus::Range<wchar_t>_*,_std::vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>_>
             ::operator++((__normal_iterator<const_Centaurus::Range<wchar_t>_*,_std::vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>_>
                           *)&ri.m_start);
    local_128._M_current =
         (Range<wchar_t> *)
         std::vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>::cend
                   (&cc->m_ranges);
    bVar1 = __gnu_cxx::operator!=(p_Var5,&local_128);
    if (bVar1) {
      pRVar6 = __gnu_cxx::
               __normal_iterator<const_Centaurus::Range<wchar_t>_*,_std::vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>_>
               ::operator*((__normal_iterator<const_Centaurus::Range<wchar_t>_*,_std::vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>_>
                            *)&ri.m_start);
      Range<wchar_t>::operator=((Range<wchar_t> *)local_68,pRVar6);
    }
  }
  Range<wchar_t>::~Range((Range<wchar_t> *)local_68);
  Range<wchar_t>::~Range((Range<wchar_t> *)local_48);
  return __return_storage_ptr__;
}

Assistant:

std::array<CharClass<TCHAR>, 3> diff_and_int(const CharClass<TCHAR>& cc) const
    {
        //Returns 3 character classes
        //ret[0] => *this & ~cc
        //ret[1] => ~(*this) & cc
        //ret[2] => *this & cc
        std::array<CharClass<TCHAR>, 3> ret;

        auto i = m_ranges.cbegin();
        auto j = cc.m_ranges.cbegin();
        
        Range<TCHAR> ri, rj;

        if (i != m_ranges.cend())
            ri = *i;
        if (j != cc.m_ranges.cend())
            rj = *j;

        while (i != m_ranges.cend() && j != cc.m_ranges.cend())
        {
            if (ri < rj)
            {
                ret[0].append(ri);
                if (++i != m_ranges.cend())
                    ri = *i;
            }
            else if (ri > rj)
            {
                ret[1].append(rj);
                if (++j != cc.m_ranges.cend())
                    rj = *j;
            }
            else
            {
                if (ri.start() < rj.start())
                {
                    //When ri begins earlier than rj
                    ret[0].append(Range<TCHAR>(ri.start(), rj.start()));
                    ri.start(rj.start());
                }
                else if (rj.start() < ri.start())
                {
                    //When rj begins earlier than ri
                    ret[1].append(Range<TCHAR>(rj.start(), ri.start()));
                    rj.start(ri.start());
                }
                else
                {
                    //ri.start() == rj.start()
                    if (ri.end() > rj.end())
                    {
                        //When ri ends later than rj
                        ret[2].append(Range<TCHAR>(rj.start(), rj.end()));
                        ri.start(rj.end());
                        if (++j != cc.m_ranges.cend())
                            rj = *j;
                    }
                    else if (ri.end() < rj.end())
                    {
                        //When rj ends later than ri
                        ret[2].append(Range<TCHAR>(ri.start(), ri.end()));
                        rj.start(ri.end());
                        if (++i != m_ranges.cend())
                            ri = *i;
                    }
                    else
                    {
                        //When ri equals to rj
                        ret[2].append(Range<TCHAR>(ri.start(), rj.end()));
                        if (++i != m_ranges.cend())
                            ri = *i;
                        if (++j != cc.m_ranges.cend())
                            rj = *j;
                    }
                }
            }
        }

        while (i != m_ranges.cend())
        {
            ret[0].append(ri);
            if (++i != m_ranges.cend())
                ri = *i;
        }
        while (j != cc.m_ranges.cend())
        {
            ret[1].append(rj);
            if (++j != cc.m_ranges.cend())
                rj = *j;
        }

        /*std::cout << ret[0] << std::endl;
        std::cout << ret[1] << std::endl;
        std::cout << ret[2] << std::endl;*/

        return ret;
    }